

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

void __thiscall
QTextDocumentPrivate::insert_string
          (QTextDocumentPrivate *this,int pos,uint strPos,uint length,int format,Operation op)

{
  BlockMap *this_00;
  uint *puVar1;
  quint32 *pqVar2;
  QTextFragmentData *pQVar3;
  QTextBlockData *pQVar4;
  QTextLayout *pQVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint n;
  uint uVar9;
  long lVar10;
  int diff;
  
  split(this,pos);
  n = QFragmentMapData<QTextFragmentData>::insert_single(&(this->fragments).data,pos,length);
  pQVar3 = (this->fragments).data.field_0.fragments;
  pQVar3[n].format = format;
  pQVar3[n].stringPosition = strPos;
  uVar9 = QFragmentMapData<QTextFragmentData>::previous(&(this->fragments).data,n);
  if (uVar9 != 0) {
    unite(this,uVar9);
  }
  this_00 = &this->blocks;
  uVar9 = QFragmentMapData<QTextBlockData>::findNode(&this_00->data,pos,0);
  pQVar4 = (this->blocks).data.field_0.fragments;
  pqVar2 = pQVar4[uVar9].super_QFragment<3>.size_array;
  *pqVar2 = *pqVar2 + length;
  uVar8 = pQVar4[uVar9].super_QFragment<3>.parent;
  uVar7 = uVar9;
  while (uVar6 = uVar8, uVar6 != 0) {
    puVar1 = (uint *)((long)(this_00->data).field_0.head + (ulong)uVar6 * 0x48);
    if (puVar1[1] == uVar7) {
      puVar1[4] = puVar1[4] + length;
    }
    uVar7 = uVar6;
    uVar8 = *puVar1;
  }
  if ((uVar9 != 0) &&
     (pQVar5 = (this_00->data).field_0.fragments[uVar9].layout, pQVar5 != (QTextLayout *)0x0)) {
    QTextEngine::invalidate(pQVar5->d);
  }
  objectForFormat(this,format);
  lVar10 = QMetaObject::cast((QObject *)&QTextFrame::staticMetaObject);
  if (lVar10 != 0) {
    (**(code **)(**(long **)(lVar10 + 8) + 0x20))
              (*(long **)(lVar10 + 8),(this->text).d.ptr[strPos],n);
    this->framesDirty = true;
  }
  adjustDocumentChangesAndCursors(this,pos,length,op);
  return;
}

Assistant:

void QTextDocumentPrivate::insert_string(int pos, uint strPos, uint length, int format, QTextUndoCommand::Operation op)
{
    // ##### optimize when only appending to the fragment!
    Q_ASSERT(noBlockInString(QStringView{text}.mid(strPos, length)));

    split(pos);
    uint x = fragments.insert_single(pos, length);
    QTextFragmentData *X = fragments.fragment(x);
    X->format = format;
    X->stringPosition = strPos;
    uint w = fragments.previous(x);
    if (w)
        unite(w);

    int b = blocks.findNode(pos);
    blocks.setSize(b, blocks.size(b)+length);

    Q_ASSERT(blocks.length() == fragments.length());

    QTextFrame *frame = qobject_cast<QTextFrame *>(objectForFormat(format));
    if (frame) {
        frame->d_func()->fragmentAdded(text.at(strPos), x);
        framesDirty = true;
    }

    adjustDocumentChangesAndCursors(pos, length, op);
}